

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O1

size_t Curl_FormReader(char *buffer,size_t size,size_t nitems,FILE *mydata)

{
  long lVar1;
  size_t sVar2;
  size_t __n;
  size_t size_00;
  char *__src;
  ulong __n_00;
  
  if (*(long *)mydata == 0) {
    sVar2 = 0;
  }
  else {
    size_00 = nitems * size;
    if (((*(uint *)(*(long *)mydata + 8) & 0xfffffffe) != 2) ||
       (sVar2 = readfromfile((Form *)mydata,buffer,size_00), sVar2 == 0)) {
      sVar2 = 0;
      while( true ) {
        __n = *(long *)(*(long *)mydata + 0x18) - (long)mydata->_IO_read_ptr;
        __n_00 = size_00 - sVar2;
        __src = mydata->_IO_read_ptr + *(long *)(*(long *)mydata + 0x10);
        if (__n_00 < __n) break;
        memcpy(buffer + sVar2,__src,__n);
        sVar2 = sVar2 + ((*(long **)mydata)[3] - (long)mydata->_IO_read_ptr);
        mydata->_IO_read_ptr = (char *)0x0;
        lVar1 = **(long **)mydata;
        *(long *)mydata = lVar1;
        if (lVar1 == 0) {
          return sVar2;
        }
        if (1 < *(uint *)(lVar1 + 8)) {
          return sVar2;
        }
      }
      memcpy(buffer + sVar2,__src,__n_00);
      mydata->_IO_read_ptr = mydata->_IO_read_ptr + __n_00;
      sVar2 = size_00;
    }
  }
  return sVar2;
}

Assistant:

size_t Curl_FormReader(char *buffer,
                       size_t size,
                       size_t nitems,
                       FILE *mydata)
{
  struct Form *form;
  size_t wantedsize;
  size_t gotsize = 0;

  form=(struct Form *)mydata;

  wantedsize = size * nitems;

  if(!form->data)
    return 0; /* nothing, error, empty */

  if((form->data->type == FORM_FILE) ||
     (form->data->type == FORM_CALLBACK)) {
    gotsize = readfromfile(form, buffer, wantedsize);

    if(gotsize)
      /* If positive or -1, return. If zero, continue! */
      return gotsize;
  }
  do {

    if((form->data->length - form->sent ) > wantedsize - gotsize) {

      memcpy(buffer + gotsize , form->data->line + form->sent,
             wantedsize - gotsize);

      form->sent += wantedsize-gotsize;

      return wantedsize;
    }

    memcpy(buffer+gotsize,
           form->data->line + form->sent,
           (form->data->length - form->sent) );
    gotsize += form->data->length - form->sent;

    form->sent = 0;

    form->data = form->data->next; /* advance */

  } while(form->data && (form->data->type < FORM_CALLBACK));
  /* If we got an empty line and we have more data, we proceed to the next
     line immediately to avoid returning zero before we've reached the end. */

  return gotsize;
}